

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplerate.c
# Opt level: O3

int src_set_ratio(SRC_STATE *state,double new_ratio)

{
  int iVar1;
  
  if (state == (SRC_STATE *)0x0) {
    iVar1 = 2;
  }
  else {
    iVar1 = 6;
    if ((0.00390625 <= new_ratio) && (new_ratio <= 256.0)) {
      state->last_ratio = new_ratio;
      return 0;
    }
  }
  return iVar1;
}

Assistant:

int
src_set_ratio (SRC_STATE *state, double new_ratio)
{
	if (state == NULL)
		return SRC_ERR_BAD_STATE ;

	if (is_bad_src_ratio (new_ratio))
		return SRC_ERR_BAD_SRC_RATIO ;

	state->last_ratio = new_ratio ;

	return SRC_ERR_NO_ERROR ;
}